

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVRFile.cpp
# Opt level: O2

char * nextfield(char *p)

{
  byte bVar1;
  ulong uVar2;
  
  if (p == (char *)0x0) {
    uVar2 = 0;
    p = (char *)0x0;
  }
  else {
    while( true ) {
      bVar1 = *p;
      if ((bVar1 < 0xe) && ((0x2601U >> (bVar1 & 0x1f) & 1) != 0)) break;
      p = (char *)((byte *)p + 1);
    }
    uVar2 = (ulong)(bVar1 == 9);
  }
  return (char *)((byte *)p + uVar2);
}

Assistant:

char *nextfield(char *p) {
	if (p) {
		while ((*p != '\t') && (*p != '\0') && (*p != '\r') && (*p != '\n')) {
			p++;
		}
	}
	if (*p == '\t') p++;
	return p;
}